

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

int __thiscall QDockAreaLayoutInfo::separatorMove(QDockAreaLayoutInfo *this,int index,int delta)

{
  QDockAreaLayoutItem *pQVar1;
  Orientation OVar2;
  QDockAreaLayoutItem *pQVar3;
  Representation RVar4;
  bool bVar5;
  int iVar6;
  pointer pQVar7;
  QSize QVar8;
  undefined1 *puVar9;
  pointer pQVar10;
  int iVar11;
  long lVar12;
  int i;
  long lVar13;
  long in_FS_OFFSET;
  QRect QVar14;
  QArrayDataPointer<QLayoutStruct> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)&local_58,(this->item_list).d.size);
  lVar12 = 0x1c;
  lVar13 = 0;
  for (puVar9 = (undefined1 *)0x0; puVar9 < (ulong)local_58.size; puVar9 = puVar9 + 1) {
    pQVar3 = (this->item_list).d.ptr;
    pQVar1 = (QDockAreaLayoutItem *)((long)&pQVar3->widgetItem + lVar13);
    pQVar7 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
    bVar5 = QDockAreaLayoutItem::skip(pQVar1);
    if (bVar5) {
      *(undefined1 *)((long)pQVar7 + lVar12 + -7) = 1;
    }
    else {
      bVar5 = QDockAreaLayoutItem::hasFixedSize(pQVar1,this->o);
      iVar6 = 0;
      if (!bVar5) {
        iVar6 = *this->sep;
      }
      *(undefined1 *)((long)pQVar7 + lVar12 + -7) = 0;
      *(undefined4 *)((long)pQVar7 + lVar12 + -4) = *(undefined4 *)((long)&pQVar3->pos + lVar13);
      *(int *)((long)&pQVar7->stretch + lVar12) = *(int *)((long)&pQVar3->size + lVar13) + iVar6;
      OVar2 = this->o;
      QVar8 = QDockAreaLayoutItem::minimumSize(pQVar1);
      RVar4 = QVar8.ht.m_i;
      if (OVar2 == Horizontal) {
        RVar4 = QVar8.wd.m_i;
      }
      *(int *)((long)pQVar7 + lVar12 + -0x10) = RVar4.m_i + iVar6;
      OVar2 = this->o;
      QVar8 = QDockAreaLayoutItem::maximumSize(pQVar1);
      RVar4 = QVar8.ht.m_i;
      if (OVar2 == Horizontal) {
        RVar4 = QVar8.wd.m_i;
      }
      *(int *)((long)pQVar7 + lVar12 + -0x14) = RVar4.m_i + iVar6;
    }
    lVar13 = lVar13 + 0x28;
    lVar12 = lVar12 + 0x20;
  }
  lVar13 = 0;
  iVar6 = separatorMoveHelper((QList<QLayoutStruct> *)&local_58,index,delta,0);
  lVar12 = 0x1c;
  for (puVar9 = (undefined1 *)0x0; puVar9 < (ulong)local_58.size; puVar9 = puVar9 + 1) {
    pQVar10 = QList<QDockAreaLayoutItem>::data(&this->item_list);
    pQVar1 = (QDockAreaLayoutItem *)((long)&pQVar10->widgetItem + lVar13);
    bVar5 = QDockAreaLayoutItem::skip(pQVar1);
    if (!bVar5) {
      pQVar7 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_58);
      bVar5 = QDockAreaLayoutItem::hasFixedSize(pQVar1,this->o);
      iVar11 = 0;
      if (!bVar5) {
        iVar11 = *this->sep;
      }
      *(int *)((long)&pQVar10->size + lVar13) = *(int *)((long)&pQVar7->stretch + lVar12) - iVar11;
      *(undefined4 *)((long)&pQVar10->pos + lVar13) = *(undefined4 *)((long)pQVar7 + lVar12 + -4);
      if (*(long *)((long)&pQVar10->subinfo + lVar13) != 0) {
        QVar14 = itemRect(this,(int)puVar9,false);
        *(QRect *)(*(long *)((long)&pQVar10->subinfo + lVar13) + 0x28) = QVar14;
        fitItems(*(QDockAreaLayoutInfo **)((long)&pQVar10->subinfo + lVar13));
      }
    }
    lVar13 = lVar13 + 0x28;
    lVar12 = lVar12 + 0x20;
  }
  QArrayDataPointer<QLayoutStruct>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

int QDockAreaLayoutInfo::separatorMove(int index, int delta)
{
#if QT_CONFIG(tabbar)
    Q_ASSERT(!tabbed);
#endif

    QList<QLayoutStruct> list(item_list.size());
    for (int i = 0; i < list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        QLayoutStruct &ls = list[i];
        Q_ASSERT(!(item.flags & QDockAreaLayoutItem::GapItem));
        if (item.skip()) {
            ls.empty = true;
        } else {
            const int separatorSpace = item.hasFixedSize(o) ? 0 : *sep;
            ls.empty = false;
            ls.pos = item.pos;
            ls.size = item.size + separatorSpace;
            ls.minimumSize = pick(o, item.minimumSize()) + separatorSpace;
            ls.maximumSize = pick(o, item.maximumSize()) + separatorSpace;

        }
    }

    //the separator space has been added to the size, so we pass 0 as a parameter
    delta = separatorMoveHelper(list, index, delta, 0 /*separator*/);

    for (int i = 0; i < list.size(); ++i) {
        QDockAreaLayoutItem &item = item_list[i];
        if (item.skip())
            continue;
        QLayoutStruct &ls = list[i];
        const int separatorSpace = item.hasFixedSize(o) ? 0 : *sep;
        item.size = ls.size - separatorSpace;
        item.pos = ls.pos;
        if (item.subinfo != nullptr) {
            item.subinfo->rect = itemRect(i);
            item.subinfo->fitItems();
        }
    }

    return delta;
}